

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void __thiscall VmFunction::MoveEntryBlockToStart(VmFunction *this)

{
  VmBlock *pVVar1;
  VmValue **ppVVar2;
  VmBlock *pVVar3;
  VmBlock *pVVar4;
  uint i;
  uint index;
  VmBlock *curr;
  VmBlock *block;
  
  block = this->firstBlock;
  if (block == (VmBlock *)0x0) {
    return;
  }
  do {
    if (block == (VmBlock *)0x0) {
      __assert_fail("entryBlock",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x86b,"void VmFunction::MoveEntryBlockToStart()");
    }
    index = 0;
    while (index < (block->super_VmValue).users.count) {
      ppVVar2 = SmallArray<VmValue_*,_8U>::operator[](&(block->super_VmValue).users,index);
      index = index + 1;
      if ((VmFunction *)*ppVVar2 == this) {
        if (this->firstBlock == block) {
          return;
        }
        DetachBlock(this,block);
        pVVar1 = this->firstBlock;
        pVVar3 = (VmBlock *)this;
        pVVar4 = block;
        if (pVVar1 != (VmBlock *)0x0) {
          pVVar1->prevSibling = block;
          pVVar3 = block;
          pVVar4 = pVVar1;
        }
        pVVar3->nextSibling = pVVar4;
        this->firstBlock = block;
        block->parent = this;
        return;
      }
    }
    block = block->nextSibling;
  } while( true );
}

Assistant:

void VmFunction::MoveEntryBlockToStart()
{
	if(!firstBlock)
		return;

	// Function must start from the first block
	VmBlock *entryBlock = NULL;

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			if(curr->users[i] == this)
			{
				entryBlock = curr;
				break;
			}
		}

		if(entryBlock)
			break;
	}

	assert(entryBlock);

	if(firstBlock != entryBlock)
	{
		// Detach entry block
		DetachBlock(entryBlock);

		// Re-attach to front
		if(!firstBlock)
		{
			firstBlock = lastBlock = entryBlock;
		}
		else
		{
			firstBlock->prevSibling = entryBlock;
			entryBlock->nextSibling = firstBlock;
			firstBlock = entryBlock;
		}

		entryBlock->parent = this;
	}
}